

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O3

void Nwk_ManPrintFanioNew(Nwk_Man_t *pNtk)

{
  int *piVar1;
  uint uVar2;
  Vec_Ptr_t *pVVar3;
  void *pvVar4;
  void **ppvVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  char Buffer [100];
  void *local_e0;
  void *local_d8;
  double local_d0;
  double local_c8;
  ulong local_c0;
  ulong local_b8;
  char local_98 [104];
  
  pVVar3 = pNtk->vObjs;
  iVar15 = pVVar3->nSize;
  uVar16 = (ulong)iVar15;
  if ((long)uVar16 < 1) {
    local_b8 = 0;
    local_c8 = 0.0;
    uVar11 = 10;
    local_c0 = 0;
    local_d0 = 0.0;
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    iVar7 = 0;
    iVar8 = 0;
    local_c0 = 0;
    local_b8 = 0;
    do {
      pvVar4 = pVVar3->pArray[uVar12];
      if ((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x20) & 7) == 3)) {
        uVar11 = *(uint *)((long)pvVar4 + 0x3c);
        uVar10 = *(uint *)((long)pvVar4 + 0x40);
        iVar8 = iVar8 + uVar11;
        iVar7 = iVar7 + uVar10;
        if ((int)local_b8 <= (int)uVar11) {
          local_b8 = (ulong)uVar11;
        }
        if ((int)local_c0 <= (int)uVar10) {
          local_c0 = (ulong)uVar10;
        }
      }
      uVar12 = uVar12 + 1;
    } while (uVar16 != uVar12);
    uVar12 = local_b8;
    if (1 < (uint)local_b8) {
      uVar12 = 0;
      uVar11 = (uint)local_b8 - 1;
      do {
        uVar12 = (ulong)((int)uVar12 + 1);
        bVar6 = 9 < uVar11;
        uVar11 = uVar11 / 10;
      } while (bVar6);
    }
    local_c8 = (double)iVar8;
    local_d0 = (double)iVar7;
    uVar11 = (int)uVar12 * 10 + 10;
    uVar12 = local_c0;
    if (1 < (uint)local_c0) {
      uVar12 = 0;
      uVar10 = (uint)local_c0 - 1;
      do {
        uVar12 = (ulong)((int)uVar12 + 1);
        bVar6 = 9 < uVar10;
        uVar10 = uVar10 / 10;
      } while (bVar6);
    }
  }
  uVar10 = (int)uVar12 * 10 + 10;
  if ((int)uVar10 < (int)uVar11) {
    uVar10 = uVar11;
  }
  uVar11 = 0x10;
  if (0xe < uVar10 - 1) {
    uVar11 = uVar10;
  }
  lVar9 = (long)(int)uVar10;
  if (uVar11 == 0) {
    local_d8 = (void *)0x0;
    memset((void *)0x0,0,lVar9 << 2);
    local_e0 = (void *)0x0;
  }
  else {
    local_d8 = malloc((long)(int)uVar11 << 2);
    memset(local_d8,0,lVar9 << 2);
    local_e0 = malloc((long)(int)uVar11 << 2);
  }
  memset(local_e0,0,lVar9 << 2);
  if (0 < iVar15) {
    ppvVar5 = pVVar3->pArray;
    uVar12 = 0;
    do {
      pvVar4 = ppvVar5[uVar12];
      if ((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x20) & 7) == 3)) {
        uVar11 = *(uint *)((long)pvVar4 + 0x3c);
        uVar14 = (ulong)(int)uVar11;
        uVar2 = *(uint *)((long)pvVar4 + 0x40);
        uVar13 = (ulong)uVar2;
        if ((long)uVar14 < 10) {
          if ((int)uVar11 < 0) goto LAB_004a234f;
LAB_004a1fda:
          if ((int)uVar10 <= (int)uVar14) goto LAB_004a234f;
LAB_004a1fe2:
          piVar1 = (int *)((long)local_d8 + uVar14 * 4);
          *piVar1 = *piVar1 + 1;
        }
        else {
          if (uVar11 < 100) {
            uVar14 = (ulong)(byte)((char)((uVar11 & 0xff) / 10) + 10);
            goto LAB_004a1fda;
          }
          if (uVar11 < 1000) {
            uVar11 = (uVar11 & 0xffff) / 100 + 0x14;
LAB_004a2081:
            if ((int)uVar10 <= (int)uVar11) goto LAB_004a234f;
            uVar14 = (ulong)uVar11;
            goto LAB_004a1fe2;
          }
          if (uVar11 < 10000) {
            uVar11 = (uVar11 & 0xffff) / 1000 + 0x1e;
            goto LAB_004a2081;
          }
          if (uVar11 < 100000) {
            uVar11 = uVar11 / 10000 + 0x28;
LAB_004a2139:
            if ((int)uVar10 <= (int)uVar11) goto LAB_004a234f;
            uVar14 = (ulong)uVar11;
            goto LAB_004a1fe2;
          }
          if (uVar11 < 1000000) {
            uVar11 = uVar11 / 100000 + 0x32;
            goto LAB_004a2139;
          }
          if (uVar11 < 10000000) {
            uVar11 = uVar11 / 1000000 + 0x3c;
            goto LAB_004a2139;
          }
        }
        if ((int)uVar2 < 10) {
          if ((int)uVar2 < 0) goto LAB_004a234f;
LAB_004a200e:
          if ((int)uVar10 <= (int)uVar13) {
LAB_004a234f:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
        }
        else {
          if (uVar2 < 100) {
            uVar13 = (ulong)(byte)((char)((uVar2 & 0xff) / 10) + 10);
            goto LAB_004a200e;
          }
          if (uVar2 < 1000) {
            uVar11 = (uVar2 & 0xffff) / 100 + 0x14;
LAB_004a20ab:
            if ((int)uVar10 <= (int)uVar11) goto LAB_004a234f;
            uVar13 = (ulong)uVar11;
          }
          else {
            if (uVar2 < 10000) {
              uVar11 = (uVar2 & 0xffff) / 1000 + 0x1e;
              goto LAB_004a20ab;
            }
            if (uVar2 < 100000) {
              uVar11 = uVar2 / 10000 + 0x28;
            }
            else if (uVar2 < 1000000) {
              uVar11 = uVar2 / 100000 + 0x32;
            }
            else {
              if (9999999 < uVar2) goto LAB_004a201e;
              uVar11 = uVar2 / 1000000 + 0x3c;
            }
            if ((int)uVar10 <= (int)uVar11) goto LAB_004a234f;
            uVar13 = (ulong)uVar11;
          }
        }
        piVar1 = (int *)((long)local_e0 + uVar13 * 4);
        *piVar1 = *piVar1 + 1;
      }
LAB_004a201e:
      uVar12 = uVar12 + 1;
    } while (uVar12 < uVar16);
  }
  puts("The distribution of fanins and fanouts in the network:");
  puts("         Number   Nodes with fanin  Nodes with fanout");
  if ((int)uVar10 < 1) {
    if (local_d8 == (void *)0x0) goto LAB_004a22f5;
  }
  else {
    uVar16 = 0;
    do {
      if ((*(int *)((long)local_d8 + uVar16 * 4) != 0) ||
         (*(int *)((long)local_e0 + uVar16 * 4) != 0)) {
        if (uVar16 < 10) {
          printf("%15d : ",uVar16 & 0xffffffff);
        }
        else {
          iVar15 = (int)((uVar16 & 0xffffffff) / 10) * -10;
          dVar18 = (double)(int)((uVar16 & 0xffffffff) / 10);
          dVar17 = pow(10.0,dVar18);
          dVar18 = pow(10.0,dVar18);
          sprintf(local_98,"%d - %d",(ulong)(uint)(((int)uVar16 + iVar15) * (int)dVar17),
                  (ulong)(((int)uVar16 + iVar15 + 1) * (int)dVar18 - 1));
          printf("%15s : ",local_98);
        }
        if (*(int *)((long)local_d8 + uVar16 * 4) == 0) {
          printf("              ");
        }
        else {
          printf("%12d  ");
        }
        printf("    ");
        if (*(int *)((long)local_e0 + uVar16 * 4) == 0) {
          printf("              ");
        }
        else {
          printf("%12d  ");
        }
        putchar(10);
      }
      uVar16 = uVar16 + 1;
    } while (uVar10 != uVar16);
  }
  free(local_d8);
LAB_004a22f5:
  if (local_e0 != (void *)0x0) {
    free(local_e0);
  }
  printf("Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",
         local_c8 / (double)pNtk->nObjs[3],local_d0 / (double)pNtk->nObjs[3],local_b8,local_c0);
  return;
}

Assistant:

void Nwk_ManPrintFanioNew( Nwk_Man_t * pNtk )
{
    char Buffer[100];
    Nwk_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts;
    int nFanins, nFanouts, nFaninsMax, nFanoutsMax, nFaninsAll, nFanoutsAll;
    int i, k, nSizeMax;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = 0;
    nFaninsAll = nFanoutsAll = 0;
    Nwk_ManForEachNode( pNtk, pNode, i )
    {
        nFanins  = Nwk_ObjFaninNum(pNode);
        nFanouts = Nwk_ObjFanoutNum(pNode);
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nFaninsMax   = Abc_MaxInt( nFaninsMax, nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Nwk_ManForEachNode( pNtk, pNode, i )
    {
        nFanins  = Nwk_ObjFaninNum(pNode);
        nFanouts = Nwk_ObjFanoutNum(pNode);
//        nFanouts = Nwk_NodeMffcSize(pNode);

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
    }

    printf( "The distribution of fanins and fanouts in the network:\n" );
    printf( "         Number   Nodes with fanin  Nodes with fanout\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            printf( "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 ); 
            printf( "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanins->pArray[k] );
        printf( "    " );
        if ( vFanouts->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanouts->pArray[k] );
        printf( "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );

    printf( "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n", 
        nFaninsMax,  1.0*nFaninsAll/Nwk_ManNodeNum(pNtk), 
        nFanoutsMax, 1.0*nFanoutsAll/Nwk_ManNodeNum(pNtk)  );
}